

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yang_print_when(lyout *out,int level,lys_module *module,lys_when *when)

{
  char *text;
  char *str;
  lys_when *plStack_28;
  int flag;
  lys_when *when_local;
  lys_module *module_local;
  lyout *plStack_10;
  int level_local;
  lyout *out_local;
  
  str._4_4_ = 0;
  plStack_28 = when;
  when_local = (lys_when *)module;
  module_local._4_4_ = level;
  plStack_10 = out;
  text = transform_json2schema(module,when->cond);
  if (text == (char *)0x0) {
    ly_print(plStack_10,"(!error!)");
  }
  else {
    ly_print(plStack_10,"%*swhen \"",(ulong)(uint)(module_local._4_4_ << 1));
    yang_encode(plStack_10,text,-1);
    ly_print(plStack_10,"\"");
    lydict_remove((ly_ctx *)when_local->cond,text);
    module_local._4_4_ = module_local._4_4_ + 1;
    if (plStack_28->ext_size != '\0') {
      yang_print_open(plStack_10,(int *)((long)&str + 4));
      yang_print_extension_instances
                (plStack_10,module_local._4_4_,(lys_module *)when_local,LYEXT_SUBSTMT_SELF,'\0',
                 plStack_28->ext,(uint)plStack_28->ext_size);
    }
    if (plStack_28->dsc != (char *)0x0) {
      yang_print_open(plStack_10,(int *)((long)&str + 4));
      yang_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_DESCRIPTION,'\0',
                         plStack_28->dsc,(lys_module *)when_local,plStack_28->ext,
                         (uint)plStack_28->ext_size);
    }
    if (plStack_28->ref != (char *)0x0) {
      yang_print_open(plStack_10,(int *)((long)&str + 4));
      yang_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_REFERENCE,'\0',plStack_28->ref,
                         (lys_module *)when_local,plStack_28->ext,(uint)plStack_28->ext_size);
    }
    module_local._4_4_ = module_local._4_4_ + -1;
    yang_print_close(plStack_10,module_local._4_4_,str._4_4_);
  }
  return;
}

Assistant:

static void
yang_print_when(struct lyout *out, int level, const struct lys_module *module, const struct lys_when *when)
{
    int flag = 0;
    const char *str;

    str = transform_json2schema(module, when->cond);
    if (!str) {
        ly_print(out, "(!error!)");
        return;
    }

    ly_print(out, "%*swhen \"", LEVEL, INDENT);
    yang_encode(out, str, -1);
    ly_print(out, "\"");
    lydict_remove(module->ctx, str);

    level++;

    if (when->ext_size) {
        /* extension is stored in lys_when incompatible with lys_node, so we cannot use yang_print_snode_common() */
        yang_print_open(out, &flag);
        yang_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0, when->ext, when->ext_size);
    }
    if (when->dsc != NULL) {
        yang_print_open(out, &flag);
        yang_print_substmt(out, level, LYEXT_SUBSTMT_DESCRIPTION, 0, when->dsc,
                           module, when->ext, when->ext_size);
    }
    if (when->ref != NULL) {
        yang_print_open(out, &flag);
        yang_print_substmt(out, level, LYEXT_SUBSTMT_REFERENCE, 0, when->ref,
                           module, when->ext, when->ext_size);
    }

    level--;
    yang_print_close(out, level, flag);
}